

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O0

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent *indent)

{
  cmTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmListFileBacktrace *backtrace;
  ostream *poVar4;
  const_reference pvVar5;
  char *pcVar6;
  reference pvVar7;
  reference str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *this_00;
  pointer ppVar8;
  cmCompiledGeneratorExpression *pcVar9;
  allocator local_329;
  string local_328;
  cmGeneratorExpression local_308;
  string local_300;
  string local_2e0;
  iterator local_2c0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
  local_2b8;
  iterator local_2b0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
  local_2a8;
  const_iterator i;
  cmPropertyMap *pm;
  string local_270;
  cmGeneratorExpression local_250;
  string local_248;
  string local_228;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_200;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f8;
  const_iterator ci;
  string local_1d0;
  cmGeneratorExpression local_1b0;
  string local_1a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_188;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_180;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  const_iterator ei;
  undefined1 local_148 [8];
  string emulatorExe;
  string local_120;
  undefined1 local_100 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulatorWithArgs;
  string local_e0;
  char *local_c0;
  char *emulator;
  cmTarget *local_98;
  cmTarget *target;
  cmMakefile *mf;
  string exe;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command;
  undefined1 local_30 [8];
  cmGeneratorExpression ge;
  Indent *indent_local;
  string *config_local;
  ostream *os_local;
  cmTestGenerator *this_local;
  
  this->TestGenerated = true;
  ge.Backtrace = (cmListFileBacktrace *)indent;
  backtrace = cmTest::GetBacktrace(this->Test);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_30,backtrace);
  poVar4 = ::operator<<(os,(cmScriptGeneratorIndent *)ge.Backtrace);
  poVar4 = std::operator<<(poVar4,"add_test(");
  cmTest::GetName_abi_cxx11_((string *)&command,this->Test);
  poVar4 = std::operator<<(poVar4,(string *)&command);
  std::operator<<(poVar4," ");
  std::__cxx11::string::~string((string *)&command);
  exe.field_2._8_8_ = cmTest::GetCommand_abi_cxx11_(this->Test);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)exe.field_2._8_8_,0);
  std::__cxx11::string::string((string *)&mf,(string *)pvVar5);
  target = (cmTarget *)cmTest::GetMakefile(this->Test);
  local_98 = cmMakefile::FindTargetToUse((cmMakefile *)target,(string *)&mf,false);
  if ((local_98 == (cmTarget *)0x0) || (TVar3 = cmTarget::GetType(local_98), TVar3 != EXECUTABLE)) {
    std::__cxx11::string::c_str();
    cmGeneratorExpression::Parse(&local_1b0,local_30);
    pcVar9 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1b0);
    pcVar1 = target;
    std::__cxx11::string::string((string *)&local_1d0);
    pcVar6 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar9,(cmMakefile *)pcVar1,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_1d0);
    std::__cxx11::string::operator=((string *)&mf,pcVar6);
    std::__cxx11::string::~string((string *)&local_1d0);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_1b0);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)&mf);
  }
  else {
    cmTarget::GetFullPath((string *)&emulator,local_98,config,false,false);
    std::__cxx11::string::operator=((string *)&mf,(string *)&emulator);
    std::__cxx11::string::~string((string *)&emulator);
    pcVar1 = local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,"CROSSCOMPILING_EMULATOR",
               (allocator *)
               ((long)&emulatorWithArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar6 = cmTarget::GetProperty(pcVar1,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&emulatorWithArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_c0 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_100);
      pcVar6 = local_c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_120,pcVar6,(allocator *)(emulatorExe.field_2._M_local_buf + 0xf));
      cmSystemTools::ExpandListArgument
                (&local_120,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,false);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)(emulatorExe.field_2._M_local_buf + 0xf));
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_100,0);
      std::__cxx11::string::string((string *)local_148,(string *)pvVar7);
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_148);
      cmOutputConverter::EscapeForCMake((string *)&ei,(string *)local_148);
      poVar4 = std::operator<<(os,(string *)&ei);
      std::operator<<(poVar4," ");
      std::__cxx11::string::~string((string *)&ei);
      local_180._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100);
      local_178 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator+(&local_180,1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_170,&local_178);
      while( true ) {
        local_188._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_100);
        bVar2 = __gnu_cxx::operator!=(&local_170,&local_188);
        if (!bVar2) break;
        str = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_170);
        cmOutputConverter::EscapeForCMake(&local_1a8,str);
        poVar4 = std::operator<<(os,(string *)&local_1a8);
        std::operator<<(poVar4," ");
        std::__cxx11::string::~string((string *)&local_1a8);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_170);
      }
      std::__cxx11::string::~string((string *)local_148);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
    }
  }
  cmOutputConverter::EscapeForCMake((string *)&ci,(string *)&mf);
  std::operator<<(os,(string *)&ci);
  std::__cxx11::string::~string((string *)&ci);
  local_200._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)exe.field_2._8_8_);
  local_1f8 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator+(&local_200,1);
  while( true ) {
    local_208._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)exe.field_2._8_8_);
    bVar2 = __gnu_cxx::operator!=(&local_1f8,&local_208);
    if (!bVar2) break;
    poVar4 = std::operator<<(os," ");
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_1f8);
    cmGeneratorExpression::Parse(&local_250,(string *)local_30);
    pcVar9 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                       ((auto_ptr<cmCompiledGeneratorExpression> *)&local_250);
    pcVar1 = target;
    std::__cxx11::string::string((string *)&local_270);
    pcVar6 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar9,(cmMakefile *)pcVar1,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_270);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,pcVar6,(allocator *)((long)&pm + 7));
    cmOutputConverter::EscapeForCMake(&local_228,&local_248);
    std::operator<<(poVar4,(string *)&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)((long)&pm + 7));
    std::__cxx11::string::~string((string *)&local_270);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_250);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1f8);
  }
  std::operator<<(os,")\n");
  this_00 = &cmTest::GetProperties(this->Test)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
          ::empty(this_00);
  if (!bVar2) {
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent *)ge.Backtrace);
    poVar4 = std::operator<<(poVar4,"set_tests_properties(");
    cmTest::GetName_abi_cxx11_((string *)&i,this->Test);
    poVar4 = std::operator<<(poVar4,(string *)&i);
    std::operator<<(poVar4," PROPERTIES ");
    std::__cxx11::string::~string((string *)&i);
    local_2b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
         ::begin(this_00);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
    ::_Rb_tree_const_iterator(&local_2a8,&local_2b0);
    while( true ) {
      local_2c0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           ::end(this_00);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
      ::_Rb_tree_const_iterator(&local_2b8,&local_2c0);
      bVar2 = std::operator!=(&local_2a8,&local_2b8);
      if (!bVar2) break;
      poVar4 = std::operator<<(os," ");
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
               ::operator->(&local_2a8);
      poVar4 = std::operator<<(poVar4,(string *)ppVar8);
      poVar4 = std::operator<<(poVar4," ");
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
               ::operator->(&local_2a8);
      cmProperty::GetValue(&ppVar8->second);
      cmGeneratorExpression::Parse(&local_308,local_30);
      pcVar9 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                         ((auto_ptr<cmCompiledGeneratorExpression> *)&local_308);
      pcVar1 = target;
      std::__cxx11::string::string((string *)&local_328);
      pcVar6 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar9,(cmMakefile *)pcVar1,config,false,(cmTarget *)0x0,(cmTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,&local_328);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_300,pcVar6,&local_329);
      cmOutputConverter::EscapeForCMake(&local_2e0,&local_300);
      std::operator<<(poVar4,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_329);
      std::__cxx11::string::~string((string *)&local_328);
      cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)&local_308);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
      ::operator++(&local_2a8);
    }
    poVar4 = std::operator<<(os,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)&mf);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_30);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent const& indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(&this->Test->GetBacktrace());

  // Start the test command.
  os << indent << "add_test(" << this->Test->GetName() << " ";

  // Get the test command line to be executed.
  std::vector<std::string> const& command = this->Test->GetCommand();

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = command[0];
  cmMakefile* mf = this->Test->GetMakefile();
  cmTarget* target = mf->FindTargetToUse(exe);
  if(target && target->GetType() == cmTarget::EXECUTABLE)
    {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    // Prepend with the emulator when cross compiling if required.
    const char * emulator =
      target->GetProperty("CROSSCOMPILING_EMULATOR");
    if (emulator != 0)
      {
      std::vector<std::string> emulatorWithArgs;
      cmSystemTools::ExpandListArgument(emulator, emulatorWithArgs);
      std::string emulatorExe(emulatorWithArgs[0]);
      cmSystemTools::ConvertToUnixSlashes(emulatorExe);
      os << cmOutputConverter::EscapeForCMake(emulatorExe) << " ";
      for(std::vector<std::string>::const_iterator ei =
          emulatorWithArgs.begin()+1;
          ei != emulatorWithArgs.end();
          ++ei)
        {
        os << cmOutputConverter::EscapeForCMake(*ei) << " ";
        }
      }
    }
  else
    {
    // Use the command name given.
    exe = ge.Parse(exe.c_str())->Evaluate(mf, config);
    cmSystemTools::ConvertToUnixSlashes(exe);
    }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);
  for(std::vector<std::string>::const_iterator ci = command.begin()+1;
      ci != command.end(); ++ci)
    {
    os << " " << cmOutputConverter::EscapeForCMake(
                                         ge.Parse(*ci)->Evaluate(mf, config));
    }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  cmPropertyMap& pm = this->Test->GetProperties();
  if(!pm.empty())
    {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
    for(cmPropertyMap::const_iterator i = pm.begin();
        i != pm.end(); ++i)
      {
      os << " " << i->first
         << " " << cmOutputConverter::EscapeForCMake(
           ge.Parse(i->second.GetValue())->Evaluate(mf, config));
      }
    os << ")" << std::endl;
    }
}